

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O1

void __thiscall
Js::ByteCodeWriter::Element
          (ByteCodeWriter *this,OpCode op,RegSlot Value,RegSlot Instance,RegSlot Element,
          bool instanceAtReturnRegOK,bool forceStrictMode)

{
  Type TVar1;
  code *pcVar2;
  RegSlot RVar3;
  bool bVar4;
  OpCode OVar5;
  RegSlot RVar6;
  RegSlot Instance_00;
  undefined4 *puVar7;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar8;
  FunctionBody *functionBody;
  undefined3 in_register_00000089;
  OpCode op_00;
  RegSlot local_48;
  RegSlot local_44;
  RegSlot local_40;
  RegSlot local_3c;
  undefined4 local_38;
  Type local_32 [4];
  ProfileId profileId;
  
  local_38 = CONCAT31(in_register_00000089,instanceAtReturnRegOK);
  local_3c = Element;
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)0x2f);
  bVar4 = OpCodeAttr::HasMultiSizeLayout(op);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x556,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar4) goto LAB_0089ebde;
    *puVar7 = 0;
  }
  if (Value != 0xffffffff) {
    if (this->m_functionWrite == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
      if (!bVar4) goto LAB_0089ebde;
      *puVar7 = 0;
    }
    RVar6 = FunctionBody::MapRegSlot(this->m_functionWrite,Value);
    if (Instance != 0xffffffff) {
      if (this->m_functionWrite == (FunctionBody *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
        if (!bVar4) goto LAB_0089ebde;
        *puVar7 = 0;
      }
      Instance_00 = FunctionBody::MapRegSlot(this->m_functionWrite,Instance);
      if (local_3c != 0xffffffff) {
        if (this->m_functionWrite == (FunctionBody *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar7 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                      ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
          if (!bVar4) goto LAB_0089ebde;
          *puVar7 = 0;
        }
        RVar3 = local_3c;
        local_3c = RVar6;
        RVar6 = FunctionBody::MapRegSlot(this->m_functionWrite,RVar3);
        op_00 = op;
        if (forceStrictMode) {
          op_00 = DeleteElemIStrict_A;
        }
        if ((*(ushort *)
              &(this->m_functionWrite->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45 &
            0x100) != 0) {
          op_00 = DeleteElemIStrict_A;
        }
        if (op != DeleteElemI_A) {
          op_00 = op;
        }
        local_32[0] = 0xffff;
        if (Instance_00 == 0 && (char)local_38 == '\0') {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar7 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                      ,0x566,"(instanceAtReturnRegOK || Instance != 0)",
                                      "instanceAtReturnRegOK || Instance != 0");
          if (!bVar4) goto LAB_0089ebde;
          *puVar7 = 0;
        }
        functionBody = this->m_functionWrite;
        bVar4 = DynamicProfileInfo::IsEnabled(AggressiveIntTypeSpecPhase,functionBody);
        uVar8 = extraout_RDX;
        if (bVar4) {
LAB_0089ea00:
          if (op_00 == StElemI_A_Strict) {
            OVar5 = ProfiledStElemI_A_Strict;
          }
          else {
            if (op_00 != StElemI_A) {
              if (op_00 != LdElemI_A) goto LAB_0089ea8d;
              TVar1 = this->m_functionWrite->profiledLdElemCount;
              local_38 = (undefined4)CONCAT71((int7)((ulong)uVar8 >> 8),TVar1 != 0xffff);
              if (TVar1 == 0xffff) {
                op_00 = LdElemI_A;
              }
              else {
                this->m_functionWrite->profiledLdElemCount = TVar1 + 1;
                local_32[0] = TVar1;
                op_00 = ProfiledLdElemI_A;
              }
              goto LAB_0089ea94;
            }
            OVar5 = ProfiledStElemI_A;
          }
          TVar1 = this->m_functionWrite->profiledStElemCount;
          local_38 = (undefined4)CONCAT71((int7)((ulong)functionBody >> 8),TVar1 != 0xffff);
          if (TVar1 != 0xffff) {
            this->m_functionWrite->profiledStElemCount = TVar1 + 1;
            local_32[0] = TVar1;
            op_00 = OVar5;
          }
        }
        else {
          functionBody = this->m_functionWrite;
          bVar4 = DynamicProfileInfo::IsEnabled(FloatTypeSpecPhase,functionBody);
          uVar8 = extraout_RDX_00;
          if (bVar4) goto LAB_0089ea00;
          functionBody = this->m_functionWrite;
          bVar4 = DynamicProfileInfo::IsEnabled(TypedArrayTypeSpecPhase,functionBody);
          uVar8 = extraout_RDX_01;
          if (bVar4) goto LAB_0089ea00;
          functionBody = this->m_functionWrite;
          bVar4 = DynamicProfileInfo::IsEnabled(ArrayCheckHoistPhase,functionBody);
          uVar8 = extraout_RDX_02;
          if (bVar4) goto LAB_0089ea00;
LAB_0089ea8d:
          local_38 = 0;
        }
LAB_0089ea94:
        RVar3 = local_3c;
        bVar4 = TryWriteElementI<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                          (this,op_00,local_3c,Instance_00,RVar6);
        if ((!bVar4) &&
           (bVar4 = TryWriteElementI<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                              (this,op_00,RVar3,Instance_00,RVar6), !bVar4)) {
          local_48 = RVar3;
          local_44 = Instance_00;
          local_40 = RVar6;
          Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,op_00,this);
          Data::Write(&this->m_byteCodeData,&local_48,0xc);
        }
        if ((char)local_38 != '\0') {
          if (local_32[0] == 0xffff) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar7 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                        ,0x58b,"(profileId != Js::Constants::NoProfileId)",
                                        "profileId != Js::Constants::NoProfileId");
            if (!bVar4) goto LAB_0089ebde;
            *puVar7 = 0;
          }
          Data::Write(&this->m_byteCodeData,local_32,2);
        }
        return;
      }
    }
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar7 = 1;
  bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                              ,0x146,"(registerID != Js::Constants::NoRegister)","bad register");
  if (bVar4) {
    *puVar7 = 0;
    Throw::InternalError();
  }
LAB_0089ebde:
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

void ByteCodeWriter::Element(OpCode op, RegSlot Value, RegSlot Instance, RegSlot Element, bool instanceAtReturnRegOK, bool forceStrictMode)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::ElementI);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        Value = ConsumeReg(Value);
        Instance = ConsumeReg(Instance);
        Element = ConsumeReg(Element);

        if (this->m_functionWrite->GetIsStrictMode() || forceStrictMode)
        {
            if (op == OpCode::DeleteElemI_A)
            {
                op = OpCode::DeleteElemIStrict_A;
            }
        }

        bool isProfiledLayout = false;
        Js::ProfileId profileId = Js::Constants::NoProfileId;
        Assert(instanceAtReturnRegOK || Instance != 0);
        if (DoDynamicProfileOpcode(AggressiveIntTypeSpecPhase) ||
            DoDynamicProfileOpcode(FloatTypeSpecPhase) ||
            DoDynamicProfileOpcode(TypedArrayTypeSpecPhase) ||
            DoDynamicProfileOpcode(ArrayCheckHoistPhase))
        {
            OpCode newop;
            switch (op)
            {
            case OpCode::LdElemI_A:
                newop = OpCode::ProfiledLdElemI_A;
                if (this->m_functionWrite->AllocProfiledLdElemId(&profileId))
                {
                    isProfiledLayout = true;
                    op = newop;
                }
                break;

            case Js::OpCode::StElemI_A:
                newop = OpCode::ProfiledStElemI_A;
                goto StoreCommon;

            case Js::OpCode::StElemI_A_Strict:
                newop = OpCode::ProfiledStElemI_A_Strict;
StoreCommon:
                if (this->m_functionWrite->AllocProfiledStElemId(&profileId))
                {
                    isProfiledLayout = true;
                    op = newop;
                }
                break;
            }
        }

        MULTISIZE_LAYOUT_WRITE(ElementI, op, Value, Instance, Element);
        if (isProfiledLayout)
        {
            Assert(profileId != Js::Constants::NoProfileId);
            m_byteCodeData.Encode(&profileId, sizeof(Js::ProfileId));
        }
    }